

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O1

string * __thiscall
VulkanHppGenerator::generateCommandResultMultiSuccessWithErrors3Return
          (string *__return_storage_ptr__,VulkanHppGenerator *this,string *name,
          CommandData *commandData,size_t initialSkipCount,bool definition,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *returnParams,bool raii)

{
  vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_> *params;
  pointer puVar1;
  _Base_ptr p_Var2;
  unsigned_long uVar3;
  vector<unsigned_long,_std::allocator<unsigned_long>_> returnParams_00;
  vector<unsigned_long,_std::allocator<unsigned_long>_> returnParams_01;
  vector<unsigned_long,_std::allocator<unsigned_long>_> returnParams_02;
  map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
  vectorParams_00;
  map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
  vectorParams_01;
  map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
  vectorParams_02;
  void *pvVar4;
  bool bVar5;
  int iVar6;
  long lVar7;
  undefined7 in_register_00000089;
  initializer_list<Flags<CommandFlavourFlagBits>_> __l;
  initializer_list<Flags<CommandFlavourFlagBits>_> __l_00;
  initializer_list<Flags<CommandFlavourFlagBits>_> __l_01;
  initializer_list<Flags<CommandFlavourFlagBits>_> __l_02;
  initializer_list<Flags<CommandFlavourFlagBits>_> __l_03;
  initializer_list<Flags<CommandFlavourFlagBits>_> __l_04;
  undefined8 uVar8;
  undefined7 in_stack_fffffffffffffe78;
  Flags<CommandFlavourFlagBits> FVar9;
  undefined1 in_stack_fffffffffffffe80;
  undefined1 unique;
  allocator_type local_17f;
  allocator_type local_17e;
  Flags<CommandFlavourFlagBits> local_17d;
  undefined4 local_17c;
  vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_> raiiFlags;
  vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_> flags;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_138;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_120;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_108;
  map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
  vectorParams;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>,_std::_Select1st<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
  local_c0;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>,_std::_Select1st<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
  local_90;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>,_std::_Select1st<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
  local_60;
  
  local_17c = (undefined4)CONCAT71(in_register_00000089,definition);
  params = &commandData->params;
  determineVectorParams(&vectorParams,this,params);
  if (vectorParams._M_t._M_impl.super__Rb_tree_header._M_node_count == 2) {
    iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (&(params->
                        super__Vector_base<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                        )._M_impl.super__Vector_impl_data._M_start
                        [*(returnParams->
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                          .super__Vector_impl_data._M_start].type.type,"uint32_t");
    if ((((iVar6 == 0) &&
         (bVar5 = isStructureType(this,&(params->
                                        super__Vector_base<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                                        )._M_impl.super__Vector_impl_data._M_start
                                        [(returnParams->
                                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                         )._M_impl.super__Vector_impl_data._M_start[1]].type.type),
         bVar5)) &&
        (bVar5 = isStructureChainAnchor
                           (this,&(params->
                                  super__Vector_base<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                                  )._M_impl.super__Vector_impl_data._M_start
                                  [(returnParams->
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   )._M_impl.super__Vector_impl_data._M_start[1]].type.type), !bVar5
        )) && ((bVar5 = isStructureType(this,&(params->
                                              super__Vector_base<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                                              )._M_impl.super__Vector_impl_data._M_start
                                              [(returnParams->
                                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                               )._M_impl.super__Vector_impl_data._M_start[2]].type.
                                              type), bVar5 &&
               (bVar5 = isStructureChainAnchor
                                  (this,&(params->
                                         super__Vector_base<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                                         )._M_impl.super__Vector_impl_data._M_start
                                         [(returnParams->
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          )._M_impl.super__Vector_impl_data._M_start[2]].type.type),
               !bVar5)))) {
      p_Var2 = vectorParams._M_t._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_parent;
      lVar7 = std::_Rb_tree_increment
                        (vectorParams._M_t._M_impl.super__Rb_tree_header._M_header._M_left);
      if (((p_Var2 == *(_Base_ptr *)(lVar7 + 0x28)) &&
          ((puVar1 = (returnParams->
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                     super__Vector_impl_data._M_start, (_Base_ptr)*puVar1 == p_Var2 &&
           (puVar1[1] ==
            *(unsigned_long *)
             (vectorParams._M_t._M_impl.super__Rb_tree_header._M_header._M_left + 1))))) &&
         (uVar3 = puVar1[2],
         lVar7 = std::_Rb_tree_increment
                           (vectorParams._M_t._M_impl.super__Rb_tree_header._M_header._M_left),
         uVar3 == *(unsigned_long *)(lVar7 + 0x20))) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_138,returnParams);
        std::
        _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>,_std::_Select1st<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
        ::_Rb_tree(&local_c0,&vectorParams._M_t);
        FVar9.m_mask = '\x01';
        unique = 0x10;
        __l_03._M_len = 2;
        __l_03._M_array = (iterator)&stack0xfffffffffffffe7f;
        std::vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
        ::vector(&flags,__l_03,&local_17f);
        local_17d.m_mask = '\x01';
        uVar8 = 0x1655d4;
        __l_04._M_len = 1;
        __l_04._M_array = &local_17d;
        std::vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
        ::vector(&raiiFlags,__l_04,&local_17e);
        returnParams_02.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)&local_c0;
        returnParams_02.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)&local_138;
        returnParams_02.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        vectorParams_02._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&raiiFlags
        ;
        vectorParams_02._M_t._M_impl._0_24_ = ZEXT924(CONCAT18(raii,&flags));
        vectorParams_02._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)uVar8;
        vectorParams_02._M_t._M_impl.super__Rb_tree_header._M_node_count._0_7_ =
             in_stack_fffffffffffffe78;
        vectorParams_02._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = FVar9.m_mask;
        generateCommandSetInclusive
                  (__return_storage_ptr__,this,name,commandData,initialSkipCount,local_17c._0_1_,
                   returnParams_02,vectorParams_02,(bool)unique,
                   (vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                    *)CONCAT62(raiiFlags.
                               super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                               ._M_impl.super__Vector_impl_data._M_start._2_6_,
                               raiiFlags.
                               super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                               ._M_impl.super__Vector_impl_data._M_start._0_2_),
                   (bool)raiiFlags.
                         super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish._0_1_,
                   (bool)raiiFlags.
                         super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_,
                   (vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                    *)flags.
                      super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
        pvVar4 = (void *)CONCAT62(raiiFlags.
                                  super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start._2_6_,
                                  raiiFlags.
                                  super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start._0_2_);
        if (pvVar4 != (void *)0x0) {
          operator_delete(pvVar4,CONCAT71(raiiFlags.
                                          super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                                          raiiFlags.
                                          super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_)
                                 - (long)pvVar4);
        }
        if (flags.
            super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(flags.
                          super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)flags.
                                super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)flags.
                                super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        std::
        _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>,_std::_Select1st<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
        ::~_Rb_tree(&local_c0);
        local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start =
             local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
        local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        goto joined_r0x0016565a;
      }
    }
  }
  else if (vectorParams._M_t._M_impl.super__Rb_tree_header._M_node_count == 1) {
    iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (&(params->
                        super__Vector_base<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                        )._M_impl.super__Vector_impl_data._M_start
                        [*(returnParams->
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                          .super__Vector_impl_data._M_start].type.type,"void");
    if (((((iVar6 != 0) &&
          (bVar5 = isHandleType(this,&(params->
                                      super__Vector_base<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                                      )._M_impl.super__Vector_impl_data._M_start
                                      [*(returnParams->
                                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                        )._M_impl.super__Vector_impl_data._M_start].type.type),
          !bVar5)) &&
         ((iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   compare(&(params->
                            super__Vector_base<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                            )._M_impl.super__Vector_impl_data._M_start
                            [(returnParams->
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                             _M_impl.super__Vector_impl_data._M_start[1]].type.type,"size_t"),
          iVar6 == 0 ||
          (iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   compare(&(params->
                            super__Vector_base<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                            )._M_impl.super__Vector_impl_data._M_start
                            [(returnParams->
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                             _M_impl.super__Vector_impl_data._M_start[1]].type.type,"uint32_t"),
          iVar6 == 0)))) &&
        ((iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  compare(&(params->
                           super__Vector_base<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                           )._M_impl.super__Vector_impl_data._M_start
                           [(returnParams->
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                            _M_impl.super__Vector_impl_data._M_start[2]].type.type,"void"),
         iVar6 == 0 ||
         ((bVar5 = isHandleType(this,&(params->
                                      super__Vector_base<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                                      )._M_impl.super__Vector_impl_data._M_start
                                      [(returnParams->
                                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                       )._M_impl.super__Vector_impl_data._M_start[2]].type.type),
          !bVar5 && (bVar5 = isStructureChainAnchor
                                       (this,&(params->
                                              super__Vector_base<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                                              )._M_impl.super__Vector_impl_data._M_start
                                              [(returnParams->
                                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                               )._M_impl.super__Vector_impl_data._M_start[2]].type.
                                              type), !bVar5)))))) &&
       ((puVar1 = (returnParams->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                  _M_impl.super__Vector_impl_data._M_start,
        (_Base_ptr)puVar1[1] ==
        vectorParams._M_t._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_parent &&
        (puVar1[2] ==
         *(unsigned_long *)(vectorParams._M_t._M_impl.super__Rb_tree_header._M_header._M_left + 1)))
       )) {
      raiiFlags.
      super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
      ._M_impl.super__Vector_impl_data._M_start._0_2_ = 0x1001;
      __l_01._M_len = 2;
      __l_01._M_array = (iterator)&raiiFlags;
      std::vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>::
      vector(&flags,__l_01,(allocator_type *)&stack0xfffffffffffffe7f);
      FVar9.m_mask = '\x01';
      __l_02._M_len = 1;
      __l_02._M_array = (iterator)&stack0xfffffffffffffe7f;
      std::vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>::
      vector(&raiiFlags,__l_02,&local_17f);
      bVar5 = isStructureChainAnchor
                        (this,&(params->
                               super__Vector_base<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                               )._M_impl.super__Vector_impl_data._M_start
                               [*(returnParams->
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                                 _M_impl.super__Vector_impl_data._M_start].type.type);
      if (bVar5) {
        std::vector<Flags<CommandFlavourFlagBits>,std::allocator<Flags<CommandFlavourFlagBits>>>::
        emplace_back<Flags<CommandFlavourFlagBits>>
                  ((vector<Flags<CommandFlavourFlagBits>,std::allocator<Flags<CommandFlavourFlagBits>>>
                    *)&flags,(Flags<CommandFlavourFlagBits> *)&stack0xfffffffffffffe7f);
        std::vector<Flags<CommandFlavourFlagBits>,std::allocator<Flags<CommandFlavourFlagBits>>>::
        emplace_back<Flags<CommandFlavourFlagBits>>
                  ((vector<Flags<CommandFlavourFlagBits>,std::allocator<Flags<CommandFlavourFlagBits>>>
                    *)&flags,(Flags<CommandFlavourFlagBits> *)&stack0xfffffffffffffe7f);
        FVar9.m_mask = '\x02';
        std::vector<Flags<CommandFlavourFlagBits>,std::allocator<Flags<CommandFlavourFlagBits>>>::
        emplace_back<Flags<CommandFlavourFlagBits>>
                  ((vector<Flags<CommandFlavourFlagBits>,std::allocator<Flags<CommandFlavourFlagBits>>>
                    *)&raiiFlags,(Flags<CommandFlavourFlagBits> *)&stack0xfffffffffffffe7f);
      }
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_120,returnParams);
      uVar8 = 0x16539a;
      std::
      _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>,_std::_Select1st<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
      ::_Rb_tree(&local_60,&vectorParams._M_t);
      returnParams_01.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)&local_60;
      returnParams_01.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)&local_120;
      returnParams_01.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      vectorParams_01._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&raiiFlags;
      vectorParams_01._M_t._M_impl._0_24_ = ZEXT924(CONCAT18(raii,&flags));
      vectorParams_01._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)uVar8;
      vectorParams_01._M_t._M_impl.super__Rb_tree_header._M_node_count._0_7_ =
           in_stack_fffffffffffffe78;
      vectorParams_01._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = FVar9.m_mask;
      generateCommandSetInclusive
                (__return_storage_ptr__,this,name,commandData,initialSkipCount,local_17c._0_1_,
                 returnParams_01,vectorParams_01,(bool)in_stack_fffffffffffffe80,
                 (vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                  *)CONCAT62(raiiFlags.
                             super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                             ._M_impl.super__Vector_impl_data._M_start._2_6_,
                             raiiFlags.
                             super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                             ._M_impl.super__Vector_impl_data._M_start._0_2_),
                 (bool)raiiFlags.
                       super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish._0_1_,
                 (bool)raiiFlags.
                       super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_,
                 (vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                  *)flags.
                    super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
      std::
      _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>,_std::_Select1st<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
      ::~_Rb_tree(&local_60);
      if (local_120.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_120.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_120.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_120.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      pvVar4 = (void *)CONCAT62(raiiFlags.
                                super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                                ._M_impl.super__Vector_impl_data._M_start._2_6_,
                                raiiFlags.
                                super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                                ._M_impl.super__Vector_impl_data._M_start._0_2_);
      local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)flags.
                    super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)flags.
                    super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
      if (pvVar4 != (void *)0x0) {
        operator_delete(pvVar4,CONCAT71(raiiFlags.
                                        super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                                        raiiFlags.
                                        super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_) -
                               (long)pvVar4);
        local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)flags.
                      super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
        local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)flags.
                      super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
      }
      goto joined_r0x0016565a;
    }
  }
  else if (((((vectorParams._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) &&
             (bVar5 = isStructureType(this,&(params->
                                            super__Vector_base<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                                            )._M_impl.super__Vector_impl_data._M_start
                                            [*(returnParams->
                                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                              )._M_impl.super__Vector_impl_data._M_start].type.type)
             , bVar5)) &&
            (bVar5 = isStructureChainAnchor
                               (this,&(params->
                                      super__Vector_base<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                                      )._M_impl.super__Vector_impl_data._M_start
                                      [*(returnParams->
                                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                        )._M_impl.super__Vector_impl_data._M_start].type.type),
            !bVar5)) &&
           ((bVar5 = isStructureType(this,&(params->
                                           super__Vector_base<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                                           )._M_impl.super__Vector_impl_data._M_start
                                           [(returnParams->
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            )._M_impl.super__Vector_impl_data._M_start[1]].type.type
                                    ), bVar5 &&
            (bVar5 = isStructureChainAnchor
                               (this,&(params->
                                      super__Vector_base<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                                      )._M_impl.super__Vector_impl_data._M_start
                                      [(returnParams->
                                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                       )._M_impl.super__Vector_impl_data._M_start[1]].type.type),
            !bVar5)))) &&
          (iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   compare(&(params->
                            super__Vector_base<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                            )._M_impl.super__Vector_impl_data._M_start
                            [(returnParams->
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                             _M_impl.super__Vector_impl_data._M_start[2]].type.type,"uint64_t"),
          iVar6 == 0)) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_108,returnParams);
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>,_std::_Select1st<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
    ::_Rb_tree(&local_90,&vectorParams._M_t);
    FVar9.m_mask = '\x01';
    __l._M_len = 1;
    __l._M_array = (iterator)&stack0xfffffffffffffe7f;
    std::vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>::
    vector(&flags,__l,&local_17f);
    local_17d.m_mask = '\x01';
    uVar8 = 0x1650cb;
    __l_00._M_len = 1;
    __l_00._M_array = &local_17d;
    std::vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>::
    vector(&raiiFlags,__l_00,&local_17e);
    returnParams_00.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)&local_90;
    returnParams_00.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&local_108;
    returnParams_00.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    vectorParams_00._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&raiiFlags;
    vectorParams_00._M_t._M_impl._0_24_ = ZEXT924(CONCAT18(raii,&flags));
    vectorParams_00._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)uVar8;
    vectorParams_00._M_t._M_impl.super__Rb_tree_header._M_node_count._0_7_ =
         in_stack_fffffffffffffe78;
    vectorParams_00._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = FVar9.m_mask;
    generateCommandSetInclusive
              (__return_storage_ptr__,this,name,commandData,initialSkipCount,local_17c._0_1_,
               returnParams_00,vectorParams_00,(bool)in_stack_fffffffffffffe80,
               (vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                *)CONCAT62(raiiFlags.
                           super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._2_6_,
                           raiiFlags.
                           super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._0_2_),
               (bool)raiiFlags.
                     super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish._0_1_,
               (bool)raiiFlags.
                     super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_,
               (vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                *)flags.
                  super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                  ._M_impl.super__Vector_impl_data._M_start);
    pvVar4 = (void *)CONCAT62(raiiFlags.
                              super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                              ._M_impl.super__Vector_impl_data._M_start._2_6_,
                              raiiFlags.
                              super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                              ._M_impl.super__Vector_impl_data._M_start._0_2_);
    if (pvVar4 != (void *)0x0) {
      operator_delete(pvVar4,CONCAT71(raiiFlags.
                                      super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                                      raiiFlags.
                                      super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_) -
                             (long)pvVar4);
    }
    if (flags.
        super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(flags.
                      super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)flags.
                            super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)flags.
                            super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>,_std::_Select1st<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
    ::~_Rb_tree(&local_90);
joined_r0x0016565a:
    if ((pointer)local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_108.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_108.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    goto LAB_0016567f;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
LAB_0016567f:
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>,_std::_Select1st<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
  ::~_Rb_tree(&vectorParams._M_t);
  return __return_storage_ptr__;
}

Assistant:

std::string VulkanHppGenerator::generateCommandResultMultiSuccessWithErrors3Return( std::string const &         name,
                                                                                    CommandData const &         commandData,
                                                                                    size_t                      initialSkipCount,
                                                                                    bool                        definition,
                                                                                    std::vector<size_t> const & returnParams,
                                                                                    bool                        raii ) const
{
  std::map<size_t, VectorParamData> vectorParams = determineVectorParams( commandData.params );
  switch ( vectorParams.size() )
  {
    case 0:
      if ( isStructureType( commandData.params[returnParams[0]].type.type ) && !isStructureChainAnchor( commandData.params[returnParams[0]].type.type ) )
      {
        if ( isStructureType( commandData.params[returnParams[1]].type.type ) && !isStructureChainAnchor( commandData.params[returnParams[1]].type.type ) )
        {
          if ( commandData.params[returnParams[2]].type.type == "uint64_t" )
          {
            return generateCommandSetInclusive( name,
                                                commandData,
                                                initialSkipCount,
                                                definition,
                                                returnParams,
                                                vectorParams,
                                                false,
                                                { CommandFlavourFlagBits::enhanced },
                                                raii,
                                                false,
                                                { CommandFlavourFlagBits::enhanced } );
          }
        }
      }
      break;
    case 1:
      if ( ( commandData.params[returnParams[0]].type.type != "void" ) && !isHandleType( commandData.params[returnParams[0]].type.type ) )
      {
        if ( ( commandData.params[returnParams[1]].type.type == "size_t" ) || ( commandData.params[returnParams[1]].type.type == "uint32_t" ) )
        {
          if ( ( commandData.params[returnParams[2]].type.type == "void" ) ||
               ( !isHandleType( commandData.params[returnParams[2]].type.type ) && !isStructureChainAnchor( commandData.params[returnParams[2]].type.type ) ) )
          {
            if ( returnParams[1] == vectorParams.begin()->second.lenParam )
            {
              if ( returnParams[2] == vectorParams.begin()->first )
              {
                std::vector<CommandFlavourFlags> flags     = { CommandFlavourFlagBits::enhanced, CommandFlavourFlagBits::withAllocator };
                std::vector<CommandFlavourFlags> raiiFlags = { CommandFlavourFlagBits::enhanced };
                if ( isStructureChainAnchor( commandData.params[returnParams[0]].type.type ) )
                {
                  flags.push_back( CommandFlavourFlagBits::chained );
                  flags.push_back( CommandFlavourFlagBits::chained | CommandFlavourFlagBits::withAllocator );
                  raiiFlags.push_back( CommandFlavourFlagBits::chained );
                }
                return generateCommandSetInclusive(
                  name, commandData, initialSkipCount, definition, returnParams, vectorParams, false, flags, raii, false, raiiFlags );
              }
            }
          }
        }
      }
      break;
    case 2:
      if ( commandData.params[returnParams[0]].type.type == "uint32_t" )
      {
        if ( isStructureType( commandData.params[returnParams[1]].type.type ) && !isStructureChainAnchor( commandData.params[returnParams[1]].type.type ) )
        {
          if ( isStructureType( commandData.params[returnParams[2]].type.type ) && !isStructureChainAnchor( commandData.params[returnParams[2]].type.type ) )
          {
            if ( vectorParams.begin()->second.lenParam == std::next( vectorParams.begin() )->second.lenParam )
            {
              if ( returnParams[0] == vectorParams.begin()->second.lenParam )
              {
                if ( returnParams[1] == vectorParams.begin()->first )
                {
                  if ( returnParams[2] == std::next( vectorParams.begin() )->first )
                  {
                    return generateCommandSetInclusive( name,
                                                        commandData,
                                                        initialSkipCount,
                                                        definition,
                                                        returnParams,
                                                        vectorParams,
                                                        false,
                                                        { CommandFlavourFlagBits::enhanced, CommandFlavourFlagBits::withAllocator },
                                                        raii,
                                                        false,
                                                        { CommandFlavourFlagBits::enhanced } );
                  }
                }
              }
            }
          }
        }
      }
      break;
  }
  return "";
}